

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void __thiscall AActor::MarkPrecacheSounds(AActor *this)

{
  AActor *this_local;
  
  FSoundID::MarkUsed(&(this->SeeSound).super_FSoundID);
  FSoundID::MarkUsed(&(this->AttackSound).super_FSoundID);
  FSoundID::MarkUsed(&(this->PainSound).super_FSoundID);
  FSoundID::MarkUsed(&(this->DeathSound).super_FSoundID);
  FSoundID::MarkUsed(&(this->ActiveSound).super_FSoundID);
  FSoundID::MarkUsed(&(this->UseSound).super_FSoundID);
  FSoundID::MarkUsed(&(this->BounceSound).super_FSoundID);
  FSoundID::MarkUsed(&(this->WallBounceSound).super_FSoundID);
  FSoundID::MarkUsed(&(this->CrushPainSound).super_FSoundID);
  return;
}

Assistant:

void AActor::MarkPrecacheSounds() const
{
	SeeSound.MarkUsed();
	AttackSound.MarkUsed();
	PainSound.MarkUsed();
	DeathSound.MarkUsed();
	ActiveSound.MarkUsed();
	UseSound.MarkUsed();
	BounceSound.MarkUsed();
	WallBounceSound.MarkUsed();
	CrushPainSound.MarkUsed();
}